

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O2

void __thiscall intel_keym_v1_t::signature_t::~signature_t(signature_t *this)

{
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__signature_t_00281858;
  std::__cxx11::string::~string((string *)&this->m_signature);
  return;
}

Assistant:

intel_keym_v1_t::signature_t::~signature_t() {
    _clean_up();
}